

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Replicate<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,1,true>const,1,1>,Eigen::internal::add_assign_op<float,float>>
               (Matrix<float,_4,_1,_0,_4,_1> *dst,
               Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
               *src,add_assign_op<float,_float> *func)

{
  undefined8 func_00;
  Matrix<float,_4,_1,_0,_4,_1> *dstExpr;
  undefined1 local_a0 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_68 [8];
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> *func_local;
  Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
  *src_local;
  Matrix<float,_4,_1,_0,_4,_1> *dst_local;
  
  srcEvaluator.
  super_unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
  ._64_8_ = func;
  evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
  ::evaluator((evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
               *)local_68,src);
  resize_if_allowed<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Replicate<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,1,true>const,1,1>,Eigen::internal::add_assign_op<float,float>>
            (dst,src,(add_assign_op<float,_float> *)
                     srcEvaluator.
                     super_unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
                     ._64_8_);
  evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
            ._64_8_;
  dstExpr = EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
              *)local_a0,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_68,
             (add_assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_1,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
         *)local_a0);
  evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
  ::~evaluator((evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>
                *)local_68);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}